

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O0

void __thiscall
MT32Emu::TVA::reset(TVA *this,Part *newPart,PartialParam *newPartialParam,RhythmTemp *newRhythmTemp)

{
  int veloAmpSubtraction;
  Partial *partial;
  System *system;
  PartialParam *partialParam;
  Bit8u partVolume;
  Bit8u expression;
  uint key_00;
  uint velocity_00;
  int iVar1;
  Tables *tables_00;
  Poly *pPVar2;
  Synth *pSVar3;
  bool bVar4;
  uint local_50;
  Bit8u local_4c;
  int newPhase;
  int newTarget;
  int velocity;
  int key;
  Tables *tables;
  RhythmTemp *newRhythmTemp_local;
  PartialParam *newPartialParam_local;
  Part *newPart_local;
  TVA *this_local;
  
  this->part = newPart;
  this->partialParam = newPartialParam;
  this->rhythmTemp = newRhythmTemp;
  this->playing = true;
  tables_00 = Tables::getInstance();
  pPVar2 = Partial::getPoly(this->partial);
  key_00 = Poly::getKey(pPVar2);
  pPVar2 = Partial::getPoly(this->partial);
  velocity_00 = Poly::getVelocity(pPVar2);
  iVar1 = calcKeyTimeSubtraction((this->partialParam->tva).envTimeKeyfollow,key_00);
  this->keyTimeSubtraction = iVar1;
  iVar1 = calcBiasAmpSubtractions(this->partialParam,key_00);
  this->biasAmpSubtraction = iVar1;
  iVar1 = calcVeloAmpSubtraction((this->partialParam->tva).veloSensitivity,velocity_00);
  this->veloAmpSubtraction = iVar1;
  partial = this->partial;
  system = this->system;
  partialParam = this->partialParam;
  partVolume = Part::getVolume(this->part);
  iVar1 = this->biasAmpSubtraction;
  veloAmpSubtraction = this->veloAmpSubtraction;
  expression = Part::getExpression(this->part);
  pSVar3 = Partial::getSynth(this->partial);
  iVar1 = calcBasicAmp(tables_00,partial,system,partialParam,partVolume,newRhythmTemp,iVar1,
                       veloAmpSubtraction,expression,
                       (*(ushort *)pSVar3->controlROMFeatures >> 2 & 1) != 0);
  local_4c = (Bit8u)iVar1;
  bVar4 = (this->partialParam->tva).envTime[0] == '\0';
  if (bVar4) {
    local_4c = (this->partialParam->tva).envLevel[0] + local_4c;
  }
  local_50 = (uint)bVar4;
  LA32Ramp::reset(this->ampRamp);
  startRamp(this,local_4c,0xff,local_50);
  return;
}

Assistant:

void TVA::reset(const Part *newPart, const TimbreParam::PartialParam *newPartialParam, const MemParams::RhythmTemp *newRhythmTemp) {
	part = newPart;
	partialParam = newPartialParam;
	rhythmTemp = newRhythmTemp;

	playing = true;

	const Tables *tables = &Tables::getInstance();

	int key = partial->getPoly()->getKey();
	int velocity = partial->getPoly()->getVelocity();

	keyTimeSubtraction = calcKeyTimeSubtraction(partialParam->tva.envTimeKeyfollow, key);

	biasAmpSubtraction = calcBiasAmpSubtractions(partialParam, key);
	veloAmpSubtraction = calcVeloAmpSubtraction(partialParam->tva.veloSensitivity, velocity);

	int newTarget = calcBasicAmp(tables, partial, system, partialParam, part->getVolume(), newRhythmTemp, biasAmpSubtraction, veloAmpSubtraction, part->getExpression(), partial->getSynth()->controlROMFeatures->quirkRingModulationNoMix);
	int newPhase;
	if (partialParam->tva.envTime[0] == 0) {
		// Initially go to the TVA_PHASE_ATTACK target amp, and spend the next phase going from there to the TVA_PHASE_2 target amp
		// Note that this means that velocity never affects time for this partial.
		newTarget += partialParam->tva.envLevel[0];
		newPhase = TVA_PHASE_ATTACK; // The first target used in nextPhase() will be TVA_PHASE_2
	} else {
		// Initially go to the base amp determined by TVA level, part volume, etc., and spend the next phase going from there to the full TVA_PHASE_ATTACK target amp.
		newPhase = TVA_PHASE_BASIC; // The first target used in nextPhase() will be TVA_PHASE_ATTACK
	}

	ampRamp->reset();//currentAmp = 0;

	// "Go downward as quickly as possible".
	// Since the current value is 0, the LA32Ramp will notice that we're already at or below the target and trying to go downward,
	// and therefore jump to the target immediately and raise an interrupt.
	startRamp(Bit8u(newTarget), 0x80 | 127, newPhase);
}